

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrhi.cpp
# Opt level: O0

QRhiShaderResourceBinding *
QRhiShaderResourceBinding::uniformBufferWithDynamicOffset
          (int binding,StageFlags stage,QRhiBuffer *buf,quint32 size)

{
  long lVar1;
  QRhiBuffer *in_RCX;
  Int in_EDX;
  int in_ESI;
  QRhiShaderResourceBinding *in_RDI;
  quint32 in_R8D;
  long in_FS_OFFSET;
  QRhiShaderResourceBinding *b;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  memset(in_RDI,0xaa,0x118);
  QRhiShaderResourceBinding((QRhiShaderResourceBinding *)0x691fae);
  (in_RDI->d).binding = in_ESI;
  (in_RDI->d).stage.super_QFlagsStorageHelper<QRhiShaderResourceBinding::StageFlag,_4>.
  super_QFlagsStorage<QRhiShaderResourceBinding::StageFlag>.i = in_EDX;
  (in_RDI->d).type = UniformBuffer;
  (in_RDI->d).u.ubuf.buf = in_RCX;
  (in_RDI->d).u.ubuf.offset = 0;
  (in_RDI->d).u.ubuf.maybeSize = in_R8D;
  (in_RDI->d).u.ubuf.hasDynamicOffset = true;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QRhiShaderResourceBinding QRhiShaderResourceBinding::uniformBufferWithDynamicOffset(
        int binding, StageFlags stage, QRhiBuffer *buf, quint32 size)
{
    Q_ASSERT(size > 0);
    QRhiShaderResourceBinding b;
    b.d.binding = binding;
    b.d.stage = stage;
    b.d.type = UniformBuffer;
    b.d.u.ubuf.buf = buf;
    b.d.u.ubuf.offset = 0;
    b.d.u.ubuf.maybeSize = size;
    b.d.u.ubuf.hasDynamicOffset = true;
    return b;
}